

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O3

LY_ERR lyb_write_string(char *str,size_t str_len,uint8_t len_size,ly_out *out,lylyb_ctx *lybctx)

{
  LY_ERR LVar1;
  ly_ctx *ctx;
  undefined8 uVar2;
  ulong local_30;
  
  if (str == (char *)0x0) {
    if (str_len == 0) {
      str = "";
      goto LAB_0013f747;
    }
    ctx = lybctx->ctx;
    uVar2 = 0x1a9;
LAB_0013f7c8:
    LVar1 = LY_EINT;
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c",
           uVar2);
  }
  else {
    if (str_len == 0) {
LAB_0013f747:
      str_len = strlen(str);
    }
    if (len_size == '\x02') {
      if (0xffff < str_len) goto LAB_0013f7a5;
    }
    else if ((len_size != '\b') && ((len_size != '\x04' || (str_len >> 0x20 != 0)))) {
LAB_0013f7a5:
      ctx = lybctx->ctx;
      uVar2 = 0x1c1;
      goto LAB_0013f7c8;
    }
    local_30 = str_len;
    LVar1 = lyb_write(out,(uint8_t *)&local_30,(ulong)len_size,lybctx);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = lyb_write(out,(uint8_t *)str,str_len,lybctx);
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyb_write_string(const char *str, size_t str_len, uint8_t len_size, struct ly_out *out, struct lylyb_ctx *lybctx)
{
    ly_bool error;

    if (!str) {
        str = "";
        LY_CHECK_ERR_RET(str_len, LOGINT(lybctx->ctx), LY_EINT);
    }

    if (!str_len) {
        str_len = strlen(str);
    }

    switch (len_size) {
    case sizeof(uint8_t):
        error = str_len > UINT8_MAX;
        break;
    case sizeof(uint16_t):
        error = str_len > UINT16_MAX;
        break;
    case sizeof(uint32_t):
        error = str_len > UINT32_MAX;
        break;
    case sizeof(uint64_t):
        error = 0;
        break;
    default:
        error = 1;
    }
    if (error) {
        LOGINT(lybctx->ctx);
        return LY_EINT;
    }

    LY_CHECK_RET(lyb_write_number(str_len, len_size, out, lybctx));

    LY_CHECK_RET(lyb_write(out, (const uint8_t *)str, str_len, lybctx));

    return LY_SUCCESS;
}